

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Str_t * Acb_GenerateInstance2(Vec_Ptr_t *vIns,Vec_Ptr_t *vOuts)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  Vec_Str_t *p;
  char *pcVar4;
  int i;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int i_1;
  
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pcVar4 = (char *)malloc(100);
  p->pArray = pcVar4;
  iVar6 = 0;
  lVar5 = 0;
  while( true ) {
    cVar1 = "  patch p0 ("[lVar5];
    if (iVar6 == p->nCap) {
      if (iVar6 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar4;
        p->nCap = 0x10;
      }
      else {
        uVar2 = iVar6 * 2;
        if (p->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc((ulong)uVar2);
        }
        else {
          pcVar4 = (char *)realloc(p->pArray,(ulong)uVar2);
        }
        p->pArray = pcVar4;
        p->nCap = uVar2;
      }
    }
    else {
      pcVar4 = p->pArray;
    }
    p->nSize = iVar6 + 1;
    pcVar4[iVar6] = cVar1;
    if (lVar5 == 0xb) break;
    iVar6 = p->nSize;
    lVar5 = lVar5 + 1;
  }
  if (0 < vOuts->nSize) {
    uVar7 = 0;
    do {
      pcVar4 = ",";
      if (uVar7 == 0) {
        pcVar4 = "";
      }
      Vec_StrPrintF(p,"%s .%s(t%d_%s)",pcVar4,vOuts->pArray[uVar7],uVar7 & 0xffffffff,
                    vOuts->pArray[uVar7]);
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)vOuts->nSize);
  }
  if (0 < vIns->nSize) {
    lVar5 = 0;
    do {
      Vec_StrPrintF(p,", .%s(%s)",vIns->pArray[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < vIns->nSize);
  }
  lVar5 = 0;
  do {
    cVar1 = "\n  );\n\n"[lVar5 + 2];
    uVar2 = p->nSize;
    if (uVar2 == p->nCap) {
      if ((int)uVar2 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar4;
        p->nCap = 0x10;
      }
      else {
        sVar3 = (ulong)uVar2 * 2;
        if (p->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar3);
        }
        else {
          pcVar4 = (char *)realloc(p->pArray,sVar3);
        }
        p->pArray = pcVar4;
        p->nCap = (int)sVar3;
      }
    }
    else {
      pcVar4 = p->pArray;
    }
    p->nSize = uVar2 + 1;
    pcVar4[(int)uVar2] = cVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  uVar2 = p->nSize;
  if (uVar2 == p->nCap) {
    if ((int)uVar2 < 0x10) {
      if (p->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(p->pArray,0x10);
      }
      p->pArray = pcVar4;
      p->nCap = 0x10;
    }
    else {
      sVar3 = (ulong)uVar2 * 2;
      if (p->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar3);
      }
      else {
        pcVar4 = (char *)realloc(p->pArray,sVar3);
      }
      p->pArray = pcVar4;
      p->nCap = (int)sVar3;
    }
  }
  else {
    pcVar4 = p->pArray;
  }
  p->nSize = uVar2 + 1;
  pcVar4[(int)uVar2] = '\0';
  return p;
}

Assistant:

Vec_Str_t * Acb_GenerateInstance2( Vec_Ptr_t * vIns, Vec_Ptr_t * vOuts )
{
    char * pName; int i;
    Vec_Str_t * vStr = Vec_StrAlloc( 100 );
    Vec_StrAppend( vStr, "  patch p0 (" );
    Vec_PtrForEachEntry( char *, vOuts, pName, i )
        Vec_StrPrintF( vStr, "%s .%s(t%d_%s)", i ? ",":"", pName, i, pName );
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_StrPrintF( vStr, ", .%s(%s)", pName, pName );
    Vec_StrAppend( vStr, " );\n\n" );
    Vec_StrPush( vStr, '\0' );
    return vStr;
}